

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  unsigned_long_long uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  GetterXsYs<unsigned_long_long> *pGVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  float fVar12;
  undefined1 auVar13 [12];
  int iVar14;
  long lVar15;
  ImDrawIdx IVar16;
  ushort uVar17;
  ImPlotContext *gp;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ImVec2 IVar23;
  double dVar24;
  ImVec2 IVar25;
  double dVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar39 [16];
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar14 = pGVar8->Count;
  iVar6 = this->Transformer->YAxis;
  iVar7 = pGVar9->Count;
  IVar23 = GImPlot->PixelRange[iVar6].Min;
  dVar24 = (double)IVar23.x;
  dVar26 = (double)IVar23.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
  uVar3 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)(((prim + 1 + pGVar9->Offset) % iVar7 + iVar7) % iVar7) * (long)pGVar9->Stride);
  lVar15 = (long)(((pGVar8->Offset + prim + 1) % iVar14 + iVar14) % iVar14) * (long)pGVar8->Stride;
  uVar4 = *(ulong *)((long)pGVar8->Ys + lVar15);
  auVar33._0_8_ = (double)CONCAT44(0x43300000,(int)uVar3);
  auVar33._8_4_ = (int)(uVar3 >> 0x20);
  auVar33._12_4_ = 0x45300000;
  uVar5 = *(ulong *)((long)pGVar8->Xs + lVar15);
  IVar23.x = (float)(((((double)(uVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar5 & 0xffffffff | 0x4330000000000000)) - dVar1) * GImPlot->Mx +
                    dVar24);
  IVar23.y = (float)(((((double)(uVar4 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                      (double)(uVar4 & 0xffffffff | 0x4330000000000000)) - dVar2) *
                     GImPlot->My[iVar6] + dVar26);
  IVar25.x = (float)((((auVar33._8_8_ - 1.9342813113834067e+25) +
                      (auVar33._0_8_ - 4503599627370496.0)) - dVar1) * GImPlot->Mx + dVar24);
  IVar25.y = (float)((pGVar9->YRef - dVar2) * GImPlot->My[iVar6] + dVar26);
  fVar12 = (this->P12).x;
  fVar27 = (this->P12).y;
  fVar29 = (this->P11).x;
  fVar30 = (this->P11).y;
  uVar21 = -(uint)(fVar30 < fVar27);
  fVar28 = (float)(~-(uint)(fVar12 <= fVar29) & (uint)fVar12 |
                  (uint)fVar29 & -(uint)(fVar12 <= fVar29));
  fVar31 = (float)(~-(uint)(fVar27 <= fVar30) & (uint)fVar27 |
                  (uint)fVar30 & -(uint)(fVar27 <= fVar30));
  fVar34 = (float)(~-(uint)(fVar29 < fVar12) & (uint)fVar12 |
                  (uint)fVar29 & -(uint)(fVar29 < fVar12));
  fVar43 = (float)(~uVar21 & (uint)fVar27 | (uint)fVar30 & uVar21);
  uVar18 = -(uint)(IVar23.x <= fVar28);
  uVar19 = -(uint)(IVar23.y <= fVar31);
  uVar20 = -(uint)(fVar34 < IVar23.x);
  uVar22 = -(uint)(fVar43 < IVar23.y);
  fVar28 = (float)(~uVar18 & (uint)IVar23.x | (uint)fVar28 & uVar18);
  fVar31 = (float)(~uVar19 & (uint)IVar23.y | (uint)fVar31 & uVar19);
  fVar34 = (float)(~uVar20 & (uint)IVar23.x | (uint)fVar34 & uVar20);
  fVar43 = (float)(~uVar22 & (uint)IVar23.y | (uint)fVar43 & uVar22);
  uVar18 = -(uint)(IVar25.x <= fVar28);
  uVar19 = -(uint)(IVar25.y <= fVar31);
  uVar20 = -(uint)(fVar34 < IVar25.x);
  uVar22 = -(uint)(fVar43 < IVar25.y);
  auVar35._0_4_ = (uint)fVar28 & uVar18;
  auVar35._4_4_ = (uint)fVar31 & uVar19;
  auVar35._8_4_ = (uint)fVar34 & uVar20;
  auVar35._12_4_ = (uint)fVar43 & uVar22;
  auVar40._0_4_ = ~uVar18 & (uint)IVar25.x;
  auVar40._4_4_ = ~uVar19 & (uint)IVar25.y;
  auVar40._8_4_ = ~uVar20 & (uint)IVar25.x;
  auVar40._12_4_ = ~uVar22 & (uint)IVar25.y;
  auVar40 = auVar40 | auVar35;
  fVar28 = (cull_rect->Min).y;
  auVar42._4_4_ = -(uint)(fVar28 < auVar40._4_4_);
  auVar42._0_4_ = -(uint)((cull_rect->Min).x < auVar40._0_4_);
  auVar13._4_8_ = auVar40._8_8_;
  auVar13._0_4_ = -(uint)(auVar40._4_4_ < fVar28);
  auVar41._0_8_ = auVar13._0_8_ << 0x20;
  auVar41._8_4_ = -(uint)(auVar40._8_4_ < (cull_rect->Max).x);
  auVar41._12_4_ = -(uint)(auVar40._12_4_ < (cull_rect->Max).y);
  auVar42._8_8_ = auVar41._8_8_;
  iVar14 = movmskps((int)cull_rect,auVar42);
  if (iVar14 == 0xf) {
    fVar31 = IVar23.y * fVar29 - fVar30 * IVar23.x;
    fVar34 = IVar25.y * fVar12 - fVar27 * IVar25.x;
    fVar28 = fVar27 - IVar25.y;
    auVar36._4_4_ = fVar28;
    auVar36._0_4_ = fVar28;
    auVar36._8_4_ = fVar28;
    auVar36._12_4_ = fVar28;
    auVar37._4_12_ = auVar36._4_12_;
    auVar37._0_4_ = fVar28 * (fVar29 - IVar23.x) - (fVar30 - IVar23.y) * (fVar12 - IVar25.x);
    auVar32._0_4_ = fVar31 * (fVar12 - IVar25.x) - fVar34 * (fVar29 - IVar23.x);
    auVar32._4_4_ = fVar31 * fVar28 - fVar34 * (fVar30 - IVar23.y);
    auVar32._8_4_ = IVar23.y * 0.0 - IVar25.y * 0.0;
    auVar32._12_4_ = IVar23.y * 0.0 - IVar25.y * 0.0;
    auVar39._0_8_ = auVar37._0_8_;
    auVar39._8_4_ = fVar28;
    auVar39._12_4_ = fVar28;
    auVar38._8_8_ = auVar39._8_8_;
    auVar38._4_4_ = auVar37._0_4_;
    auVar38._0_4_ = auVar37._0_4_;
    auVar33 = divps(auVar32,auVar38);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = this->Col;
    pIVar10[1].pos = IVar23;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = this->Col;
    pIVar10[2].pos = auVar33._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = this->Col;
    pIVar10[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = this->Col;
    pIVar10[4].pos = IVar25;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar10 + 5;
    uVar18 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar18;
    *pIVar11 = IVar16;
    uVar17 = (byte)((byte)uVar21 & IVar25.y < IVar23.y | -(fVar27 < fVar30) & -(IVar23.y < IVar25.y)
                   ) & 1;
    pIVar11[1] = IVar16 + uVar17 + 1;
    pIVar11[2] = IVar16 + 3;
    pIVar11[3] = IVar16 + 1;
    pIVar11[4] = (uVar17 ^ 3) + IVar16;
    pIVar11[5] = IVar16 + 4;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar18 + 5;
  }
  this->P11 = IVar23;
  this->P12 = IVar25;
  return (char)iVar14 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }